

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O1

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::operator==
          (FramebufferCacheKey *this,FramebufferCacheKey *rhs)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  sVar4 = GetHash(this);
  sVar5 = GetHash(rhs);
  if (((((sVar4 == sVar5) && (this->Pass == rhs->Pass)) &&
       (uVar1 = this->NumRenderTargets, uVar1 == rhs->NumRenderTargets)) &&
      ((this->DSV == rhs->DSV && (this->ShadingRate == rhs->ShadingRate)))) &&
     (this->CommandQueueMask == rhs->CommandQueueMask)) {
    bVar8 = uVar1 == 0;
    if ((!bVar8) && (this->RTVs[0] == rhs->RTVs[0])) {
      lVar7 = 0;
      do {
        iVar6 = (int)lVar7;
        if (uVar1 - 1 == iVar6) break;
        lVar2 = lVar7 + 1;
        lVar3 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while (this->RTVs[lVar2] == rhs->RTVs[lVar3]);
      bVar8 = uVar1 <= iVar6 + 1U;
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::operator==(const FramebufferCacheKey& rhs) const
{
    // clang-format off
    if (GetHash()        != rhs.GetHash()        ||
        Pass             != rhs.Pass             ||
        NumRenderTargets != rhs.NumRenderTargets ||
        DSV              != rhs.DSV              ||
        ShadingRate      != rhs.ShadingRate      ||
        CommandQueueMask != rhs.CommandQueueMask)
    {
        return false;
    }
    // clang-format on

    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
        if (RTVs[rt] != rhs.RTVs[rt])
            return false;

    return true;
}